

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O3

bool __thiscall SubCircuit<4>::propagateSCC(SubCircuit<4> *this,int root)

{
  int *piVar1;
  PROP *pPVar2;
  undefined8 uVar3;
  long lVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  Lit LVar8;
  Lit LVar9;
  int iVar10;
  IntView<4> *pIVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  vec<int> *pvVar16;
  vec<int> *pvVar17;
  vec<SubCircuit<4>::PROP> *pvVar18;
  uint uVar19;
  uint uVar20;
  IntVar *pIVar21;
  uint i;
  ulong uVar22;
  undefined1 auVar23 [8];
  Clause *pCVar24;
  vec<int> *pvVar25;
  Clause *c;
  int backto;
  int backfrom;
  int numback;
  vec<int> local_2a8;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  bool local_288;
  int local_27c;
  vec<int> local_278;
  vec<int> local_268;
  uint local_24c;
  ulong local_248;
  int local_240;
  int local_23c;
  vec<int> local_238;
  int local_224;
  int local_220;
  int local_21c;
  vec<int> *local_218;
  vec<int> *local_210;
  Clause *local_208;
  vec<SubCircuit<4>::PROP> *local_200;
  int **local_1f8;
  vec<int> local_1f0;
  vec<int> local_1e0;
  vec<int> local_1d0;
  vec<int> local_1c0;
  vec<int> local_1b0;
  vec<int> local_1a0;
  vec<int> local_190;
  vec<int> local_180;
  vec<int> local_170;
  vec<int> local_160;
  vec<int> local_150;
  vec<int> local_140;
  vec<int> local_130;
  vec<int> local_120;
  vec<int> local_110;
  vec<int> local_100;
  vec<int> local_f0;
  vec<int> local_e0;
  vec<int> local_d0;
  vec<int> local_c0;
  vec<int> local_b0;
  vec<int> local_a0;
  vec<int> local_90;
  vec<int> local_80;
  vec<int> local_70;
  int local_5c;
  IntView<4> *local_58;
  ulong local_50;
  vec<int> *local_48;
  IntVar *local_40;
  long local_38;
  
  local_23c = 0;
  local_240 = 0;
  local_21c = 0;
  local_2a8.sz = 0;
  local_2a8.cap = 0;
  local_2a8.data = (int *)0x0;
  local_24c = root;
  vec<int>::reserve(&local_2a8,*(uint *)&(this->super_Propagator).field_0x14);
  pvVar17 = &this->prev;
  if ((this->prev).data != (int *)0x0) {
    pvVar17->sz = 0;
  }
  local_210 = &this->earlier;
  if ((this->earlier).data != (int *)0x0) {
    local_210->sz = 0;
  }
  pvVar25 = &this->later;
  if ((this->later).data != (int *)0x0) {
    pvVar25->sz = 0;
  }
  piVar1 = this->index;
  if (0 < *(int *)&(this->super_Propagator).field_0x14) {
    lVar12 = 0;
    do {
      piVar1[lVar12] = -1;
      lVar12 = lVar12 + 1;
      root = local_24c;
    } while (lVar12 < *(int *)&(this->super_Propagator).field_0x14);
  }
  piVar1[root] = 0;
  this->lowlink[(int)local_24c] = 0;
  this->nodesSeen = 1;
  local_200 = &this->propQueue;
  if ((this->propQueue).data != (PROP *)0x0) {
    local_200->sz = 0;
  }
  pIVar21 = this->x[(int)local_24c].var;
  iVar7 = (pIVar21->min).v;
  local_58 = this->x + (int)local_24c;
  local_1f8 = &local_140.data;
  local_248 = 0;
  iVar10 = 0;
  local_48 = pvVar17;
  local_40 = pIVar21;
  do {
    lVar12 = (long)iVar7;
    lVar15 = local_58->b + lVar12;
    if (this->index[lVar15] == -1) {
      local_21c = 0;
      local_5c = iVar7;
      local_38 = lVar12;
      bVar5 = exploreSubtree(this,(int)lVar15,(int)local_248,iVar10,&local_23c,&local_240,&local_21c
                            );
      if (!bVar5) goto LAB_001461a8;
      if (local_2a8.data != (int *)0x0) {
        local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
      }
      if ((this->later).data != (int *)0x0) {
        pvVar25->sz = 0;
      }
      local_298 = (undefined1  [8])((ulong)local_298 & 0xffffffff00000000);
      if (0 < *(int *)&(this->super_Propagator).field_0x14) {
        iVar7 = 0;
        do {
          pvVar16 = pvVar25;
          if ((this->index[iVar7] < 0) || (pvVar16 = &local_2a8, iVar10 < this->index[iVar7])) {
            vec<int>::push(pvVar16,(int *)local_298);
          }
          iVar7 = local_298._0_4_ + 1;
          local_298._0_4_ = iVar7;
        } while (iVar7 < *(int *)&(this->super_Propagator).field_0x14);
      }
      uVar22 = local_2a8._0_8_ & 0xffffffff;
      local_70.sz = local_2a8.sz;
      local_70.cap = local_2a8.sz;
      local_70.data = (int *)malloc(uVar22 * 4);
      if (uVar22 != 0) {
        uVar14 = 0;
        do {
          local_70.data[uVar14] = local_2a8.data[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar22 != uVar14);
      }
      LVar8 = getEvidenceLit(this,&local_70);
      if (local_70.data != (int *)0x0) {
        free(local_70.data);
      }
      local_70.data = (int *)0x0;
      local_80.sz = pvVar17->sz;
      uVar22 = (ulong)local_80.sz;
      local_80.cap = local_80.sz;
      local_80.data = (int *)malloc(uVar22 * 4);
      if (uVar22 != 0) {
        piVar1 = (this->prev).data;
        uVar14 = 0;
        do {
          local_80.data[uVar14] = piVar1[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar22 != uVar14);
      }
      LVar9 = getEvidenceLit(this,&local_80);
      if (local_80.data != (int *)0x0) {
        free(local_80.data);
      }
      local_80.data = (int *)0x0;
      local_278.sz = 0;
      local_278.cap = 0;
      local_278.data = (int *)0x0;
      if (pvVar17->sz == 0) {
        local_27c = LVar8.x;
        if (pvVar25->sz != 0) {
          lVar12 = 0;
          uVar22 = 0;
          do {
            vec<int>::push(&local_278,(int *)((long)(this->later).data + lVar12));
            uVar22 = uVar22 + 1;
            lVar12 = lVar12 + 4;
          } while (uVar22 < (this->later).sz);
        }
        vec<int>::push(&local_278,(int *)&local_24c);
        uVar22 = local_278._0_8_ & 0xffffffff;
        local_90.sz = local_278.sz;
        local_90.cap = local_278.sz;
        local_90.data = (int *)malloc(uVar22 * 4);
        if (uVar22 != 0) {
          uVar14 = 0;
          do {
            local_90.data[uVar14] = local_278.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar22 != uVar14);
        }
        LVar9 = getEvidenceLit(this,&local_90);
        pvVar17 = local_48;
        LVar8.x = local_27c;
        if (local_90.data != (int *)0x0) {
          free(local_90.data);
        }
        local_90.data = (int *)0x0;
      }
      local_220 = iVar10;
      if (LVar9.x == 1 || LVar8.x == 1) {
LAB_001459f4:
        pvVar16 = local_210;
        if (pvVar17->sz != 0) {
          lVar12 = 0;
          uVar22 = 0;
          do {
            vec<int>::push(pvVar16,(int *)((long)(this->prev).data + lVar12));
            uVar22 = uVar22 + 1;
            lVar12 = lVar12 + 4;
          } while (uVar22 < (this->prev).sz);
        }
        if ((this->prev).data != (int *)0x0) {
          pvVar17->sz = 0;
        }
        if (local_2a8.sz != 0) {
          lVar12 = 0;
          uVar22 = 0;
          do {
            vec<int>::push(pvVar17,(int *)((long)local_2a8.data + lVar12));
            uVar22 = uVar22 + 1;
            lVar12 = lVar12 + 4;
          } while (uVar22 < (local_2a8._0_8_ & 0xffffffff));
        }
        local_248 = (ulong)(local_220 + 1);
        local_220 = this->nodesSeen + -1;
        bVar5 = true;
      }
      else {
        if (local_21c != 0) {
          if ((local_21c != 1) || (this->fixReq == false)) goto LAB_001459f4;
          if (so.lazy == true) {
            if (pvVar17->sz == 0) {
              iVar7 = local_278.sz * local_2a8.sz + 2;
              local_27c = LVar8.x;
              local_298 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
              *(uint *)local_298 = iVar7 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
              auVar23 = local_298;
              if ((*(uint *)local_298 < 0x200) ||
                 (*(int *)((long)local_298 + 8) = local_27c, *(uint *)local_298 < 0x300))
              goto LAB_001461cd;
              ((Clause *)((long)local_298 + 8))->data[0].x = LVar9.x;
              uVar22 = local_2a8._0_8_ & 0xffffffff;
              local_120.sz = local_2a8.sz;
              local_120.cap = local_2a8.sz;
              local_120.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                uVar14 = 0;
                do {
                  local_120.data[uVar14] = local_2a8.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              uVar22 = local_278._0_8_ & 0xffffffff;
              local_130.sz = local_278.sz;
              local_130.cap = local_278.sz;
              local_130.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                uVar14 = 0;
                do {
                  local_130.data[uVar14] = local_278.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              explainAcantreachB(this,(Clause *)auVar23,3,&local_120,&local_130,local_23c,local_240)
              ;
              if (local_130.data != (int *)0x0) {
                free(local_130.data);
              }
              local_130.data = (int *)0x0;
              if (local_120.data != (int *)0x0) {
                free(local_120.data);
              }
              local_120.data = (int *)0x0;
            }
            else {
              local_298 = (undefined1  [8])0x0;
              uStack_290 = (int *)0x0;
              lVar12 = 0;
              uVar22 = 0;
              local_27c = LVar8.x;
              local_224 = LVar9.x;
              do {
                vec<int>::push((vec<int> *)local_298,(int *)((long)(this->prev).data + lVar12));
                uVar22 = uVar22 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar22 < (this->prev).sz);
              if (pvVar25->sz != 0) {
                lVar12 = 0;
                uVar22 = 0;
                do {
                  vec<int>::push((vec<int> *)local_298,(int *)((long)(this->later).data + lVar12));
                  uVar22 = uVar22 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar22 < (this->later).sz);
              }
              local_268._0_8_ = (Clause *)0x0;
              local_268.data = (int *)0x0;
              local_218 = pvVar25;
              if (local_298._0_4_ != 0) {
                lVar12 = 0;
                uVar22 = 0;
                do {
                  vec<int>::push(&local_268,(int *)((long)uStack_290 + lVar12));
                  uVar22 = uVar22 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar22 < ((ulong)local_298 & 0xffffffff));
              }
              if (local_2a8.sz == 0) {
LAB_001455b0:
                local_238.data = (int *)0x0;
                local_238.sz = 0;
                local_238.cap = 0;
                uVar20 = 0;
              }
              else {
                lVar12 = 0;
                uVar22 = 0;
                do {
                  vec<int>::push(&local_268,(int *)((long)local_2a8.data + lVar12));
                  uVar22 = uVar22 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar22 < (local_2a8._0_8_ & 0xffffffff));
                local_238.sz = 0;
                local_238.cap = 0;
                local_238.data = (int *)0x0;
                if (local_2a8.sz == 0) goto LAB_001455b0;
                lVar12 = 0;
                uVar22 = 0;
                do {
                  vec<int>::push(&local_238,(int *)((long)local_2a8.data + lVar12));
                  uVar22 = uVar22 + 1;
                  lVar12 = lVar12 + 4;
                  uVar20 = local_2a8.sz;
                } while (uVar22 < (local_2a8._0_8_ & 0xffffffff));
              }
              if (local_218->sz != 0) {
                lVar12 = 0;
                uVar22 = 0;
                do {
                  vec<int>::push(&local_238,(int *)((long)(this->later).data + lVar12));
                  uVar22 = uVar22 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar22 < (this->later).sz);
                uVar20 = local_2a8.sz;
              }
              uVar13 = local_268.sz * local_210->sz;
              local_248 = (ulong)uVar13;
              uVar19 = local_238.sz * pvVar17->sz;
              iVar7 = uVar20 * local_298._0_4_ + uVar13 + uVar19 + 2;
              local_208 = (Clause *)malloc((long)iVar7 * 4 + 8);
              *(uint *)local_208 = iVar7 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_208);
              auVar23 = (undefined1  [8])local_208;
              pvVar25 = local_218;
              if ((*(uint *)local_208 < 0x200) ||
                 (*(int *)(local_208 + 1) = local_27c, local_50 = (ulong)uVar19,
                 *(uint *)local_208 < 0x300)) goto LAB_001461cd;
              local_208[1].data[0].x = local_224;
              local_140.sz = local_210->sz;
              uVar22 = (ulong)local_140.sz;
              local_140.cap = local_140.sz;
              local_140.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                piVar1 = (this->earlier).data;
                uVar14 = 0;
                do {
                  local_140.data[uVar14] = piVar1[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              uVar22 = local_268._0_8_ & 0xffffffff;
              local_150.sz = local_268.sz;
              local_150.cap = local_268.sz;
              local_150.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                uVar14 = 0;
                do {
                  local_150.data[uVar14] = local_268.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              explainAcantreachB(this,(Clause *)auVar23,3,&local_140,&local_150,-1,-1);
              if (local_150.data != (int *)0x0) {
                free(local_150.data);
              }
              local_150.data = (int *)0x0;
              if (local_140.data != (int *)0x0) {
                free(local_140.data);
              }
              local_140.data = (int *)0x0;
              local_160.sz = pvVar17->sz;
              uVar22 = (ulong)local_160.sz;
              local_160.cap = local_160.sz;
              local_160.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                piVar1 = (this->prev).data;
                uVar14 = 0;
                do {
                  local_160.data[uVar14] = piVar1[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              uVar22 = local_238._0_8_ & 0xffffffff;
              local_170.sz = local_238.sz;
              local_170.cap = local_238.sz;
              local_170.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                uVar14 = 0;
                do {
                  local_170.data[uVar14] = local_238.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              uVar20 = (int)local_248 + 3;
              explainAcantreachB(this,(Clause *)auVar23,uVar20,&local_160,&local_170,-1,-1);
              if (local_170.data != (int *)0x0) {
                free(local_170.data);
              }
              local_170.data = (int *)0x0;
              local_248 = (ulong)uVar20;
              if (local_160.data != (int *)0x0) {
                free(local_160.data);
              }
              local_160.data = (int *)0x0;
              uVar22 = local_2a8._0_8_ & 0xffffffff;
              local_180.sz = local_2a8.sz;
              local_180.cap = local_2a8.sz;
              local_180.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                uVar14 = 0;
                do {
                  local_180.data[uVar14] = local_2a8.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              uVar22 = (ulong)local_298 & 0xffffffff;
              local_190.sz = local_298._0_4_;
              local_190.cap = local_298._0_4_;
              local_190.data = (int *)malloc(uVar22 * 4);
              if (uVar22 != 0) {
                uVar14 = 0;
                do {
                  local_190.data[uVar14] = uStack_290[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar22 != uVar14);
              }
              explainAcantreachB(this,(Clause *)auVar23,(int)local_50 + (int)local_248,&local_180,
                                 &local_190,local_23c,local_240);
              if (local_190.data != (int *)0x0) {
                free(local_190.data);
              }
              local_190.data = (int *)0x0;
              if (local_180.data != (int *)0x0) {
                free(local_180.data);
              }
              local_180.data = (int *)0x0;
              if (local_238.data != (int *)0x0) {
                free(local_238.data);
              }
              if (local_268.data != (int *)0x0) {
                free(local_268.data);
              }
              if (uStack_290 != (int *)0x0) {
                free(uStack_290);
              }
            }
          }
          else {
            auVar23 = (undefined1  [8])0x0;
          }
          uStack_290 = (int *)CONCAT44(local_240,local_23c);
          local_288 = true;
          local_298 = auVar23;
          vec<SubCircuit<4>::PROP>::push(local_200,(PROP *)local_298);
          goto LAB_001459f4;
        }
        if (so.lazy == true) {
          if (pvVar17->sz == 0) {
            iVar7 = local_278.sz * local_2a8.sz + 2;
            local_27c = LVar8.x;
            local_298 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
            *(uint *)local_298 = iVar7 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
            auVar23 = local_298;
            if ((*(uint *)local_298 < 0x200) ||
               (*(int *)((long)local_298 + 8) = local_27c, *(uint *)local_298 < 0x300))
            goto LAB_001461cd;
            ((Clause *)((long)local_298 + 8))->data[0].x = LVar9.x;
            uVar22 = local_2a8._0_8_ & 0xffffffff;
            local_a0.sz = local_2a8.sz;
            local_a0.cap = local_2a8.sz;
            local_a0.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              uVar14 = 0;
              do {
                local_a0.data[uVar14] = local_2a8.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            uVar22 = local_278._0_8_ & 0xffffffff;
            local_b0.sz = local_278.sz;
            local_b0.cap = local_278.sz;
            local_b0.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              uVar14 = 0;
              do {
                local_b0.data[uVar14] = local_278.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            explainAcantreachB(this,(Clause *)auVar23,3,&local_a0,&local_b0,*local_2a8.data,
                               *local_278.data);
            if (local_b0.data != (int *)0x0) {
              free(local_b0.data);
            }
            local_b0.data = (int *)0x0;
            if (local_a0.data != (int *)0x0) {
              free(local_a0.data);
            }
            local_a0.data = (int *)0x0;
            pIVar21 = this->x[*local_2a8.data].var;
            (*(pIVar21->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar21,(long)*local_278.data - (long)this->x[*local_2a8.data].b,auVar23,1);
          }
          else {
            local_298 = (undefined1  [8])0x0;
            uStack_290 = (int *)0x0;
            lVar12 = 0;
            uVar22 = 0;
            local_27c = LVar8.x;
            local_224 = LVar9.x;
            do {
              vec<int>::push((vec<int> *)local_298,(int *)((long)(this->prev).data + lVar12));
              uVar22 = uVar22 + 1;
              lVar12 = lVar12 + 4;
            } while (uVar22 < (this->prev).sz);
            if (pvVar25->sz != 0) {
              lVar12 = 0;
              uVar22 = 0;
              do {
                vec<int>::push((vec<int> *)local_298,(int *)((long)(this->later).data + lVar12));
                uVar22 = uVar22 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar22 < (this->later).sz);
            }
            local_268._0_8_ = (Clause *)0x0;
            local_268.data = (int *)0x0;
            if (local_298._0_4_ != 0) {
              lVar12 = 0;
              uVar22 = 0;
              do {
                vec<int>::push(&local_268,(int *)((long)uStack_290 + lVar12));
                uVar22 = uVar22 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar22 < ((ulong)local_298 & 0xffffffff));
            }
            if (local_2a8.sz == 0) {
LAB_00145156:
              local_238.data = (int *)0x0;
              local_238.sz = 0;
              local_238.cap = 0;
              uVar20 = 0;
            }
            else {
              lVar12 = 0;
              uVar22 = 0;
              do {
                vec<int>::push(&local_268,(int *)((long)local_2a8.data + lVar12));
                uVar22 = uVar22 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar22 < (local_2a8._0_8_ & 0xffffffff));
              local_238.sz = 0;
              local_238.cap = 0;
              local_238.data = (int *)0x0;
              if (local_2a8.sz == 0) goto LAB_00145156;
              lVar12 = 0;
              uVar22 = 0;
              do {
                vec<int>::push(&local_238,(int *)((long)local_2a8.data + lVar12));
                uVar22 = uVar22 + 1;
                lVar12 = lVar12 + 4;
                uVar20 = local_2a8.sz;
              } while (uVar22 < (local_2a8._0_8_ & 0xffffffff));
            }
            if (pvVar25->sz != 0) {
              lVar12 = 0;
              uVar22 = 0;
              do {
                vec<int>::push(&local_238,(int *)((long)(this->later).data + lVar12));
                uVar22 = uVar22 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar22 < (this->later).sz);
              uVar20 = local_2a8.sz;
            }
            uVar13 = local_268.sz * local_210->sz;
            iVar10 = local_238.sz * pvVar17->sz;
            iVar7 = uVar20 * local_298._0_4_ + uVar13 + iVar10 + 2;
            local_208 = (Clause *)malloc((long)iVar7 * 4 + 8);
            *(uint *)local_208 = iVar7 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_208);
            pCVar24 = local_208;
            if ((*(uint *)local_208 < 0x200) ||
               (*(int *)(local_208 + 1) = local_27c, local_218 = (vec<int> *)(ulong)uVar13,
               *(uint *)local_208 < 0x300)) goto LAB_001461cd;
            local_208[1].data[0].x = local_224;
            local_c0.sz = local_210->sz;
            uVar22 = (ulong)local_c0.sz;
            local_c0.cap = local_c0.sz;
            local_c0.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              piVar1 = (this->earlier).data;
              uVar14 = 0;
              do {
                local_c0.data[uVar14] = piVar1[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            uVar22 = local_268._0_8_ & 0xffffffff;
            local_d0.sz = local_268.sz;
            local_d0.cap = local_268.sz;
            local_d0.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              uVar14 = 0;
              do {
                local_d0.data[uVar14] = local_268.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            explainAcantreachB(this,pCVar24,3,&local_c0,&local_d0,-1,-1);
            if (local_d0.data != (int *)0x0) {
              free(local_d0.data);
            }
            local_d0.data = (int *)0x0;
            if (local_c0.data != (int *)0x0) {
              free(local_c0.data);
            }
            local_c0.data = (int *)0x0;
            local_e0.sz = pvVar17->sz;
            uVar22 = (ulong)local_e0.sz;
            local_e0.cap = local_e0.sz;
            local_e0.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              piVar1 = (this->prev).data;
              uVar14 = 0;
              do {
                local_e0.data[uVar14] = piVar1[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            uVar22 = local_238._0_8_ & 0xffffffff;
            local_f0.sz = local_238.sz;
            local_f0.cap = local_238.sz;
            local_f0.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              uVar14 = 0;
              do {
                local_f0.data[uVar14] = local_238.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            uVar20 = (int)local_218 + 3;
            explainAcantreachB(this,pCVar24,uVar20,&local_e0,&local_f0,-1,-1);
            if (local_f0.data != (int *)0x0) {
              free(local_f0.data);
            }
            local_f0.data = (int *)0x0;
            local_218 = (vec<int> *)(ulong)uVar20;
            if (local_e0.data != (int *)0x0) {
              free(local_e0.data);
            }
            local_e0.data = (int *)0x0;
            uVar22 = local_2a8._0_8_ & 0xffffffff;
            local_100.sz = local_2a8.sz;
            local_100.cap = local_2a8.sz;
            local_100.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              uVar14 = 0;
              do {
                local_100.data[uVar14] = local_2a8.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            uVar22 = (ulong)local_298 & 0xffffffff;
            local_110.sz = local_298._0_4_;
            local_110.cap = local_298._0_4_;
            local_110.data = (int *)malloc(uVar22 * 4);
            if (uVar22 != 0) {
              uVar14 = 0;
              do {
                local_110.data[uVar14] = uStack_290[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar22 != uVar14);
            }
            explainAcantreachB(this,pCVar24,iVar10 + (int)local_218,&local_100,&local_110,
                               *local_2a8.data,*uStack_290);
            if (local_110.data != (int *)0x0) {
              free(local_110.data);
            }
            local_110.data = (int *)0x0;
            if (local_100.data != (int *)0x0) {
              free(local_100.data);
            }
            local_100.data = (int *)0x0;
            pIVar21 = this->x[*local_2a8.data].var;
            (*(pIVar21->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar21,(long)*uStack_290 - (long)this->x[*local_2a8.data].b,pCVar24,1);
            if (local_238.data != (int *)0x0) {
              free(local_238.data);
            }
            if (local_268.data != (int *)0x0) {
              free(local_268.data);
            }
            if (uStack_290 != (int *)0x0) {
              free(uStack_290);
            }
          }
        }
        bVar5 = false;
      }
      if (local_278.data != (int *)0x0) {
        free(local_278.data);
      }
      lVar12 = local_38;
      pIVar21 = local_40;
      iVar7 = local_5c;
      iVar10 = local_220;
      if (!bVar5) goto LAB_001461a8;
    }
    if (iVar7 == (pIVar21->max).v) break;
    lVar15 = 0;
    do {
      lVar4 = lVar15 + lVar12 + 1;
      lVar15 = lVar15 + 1;
    } while (pIVar21->vals[lVar4].v == '\0');
    iVar7 = iVar7 + (int)lVar15;
  } while (-0x80000000 - lVar12 != lVar15);
  iVar7 = *(int *)&(this->super_Propagator).field_0x14;
  iVar10 = this->nodesSeen;
  uVar20 = (uint)local_248;
  if (iVar10 != iVar7) {
    local_298 = (undefined1  [8])0x0;
    uStack_290 = (int *)0x0;
    local_278.sz = 0;
    local_278.cap = 0;
    local_278.data = (int *)0x0;
    local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
    if (iVar7 < 1) {
      uVar13 = 0;
    }
    else {
      iVar10 = 0;
      do {
        pvVar17 = &local_278;
        if (-1 < this->index[iVar10]) {
          pvVar17 = (vec<int> *)local_298;
        }
        vec<int>::push(pvVar17,(int *)&local_268);
        iVar10 = local_268.sz + 1;
        local_268.sz = iVar10;
        iVar7 = *(int *)&(this->super_Propagator).field_0x14;
      } while (iVar10 < iVar7);
      iVar10 = this->nodesSeen;
      uVar20 = (uint)local_248;
      uVar13 = local_298._0_4_;
    }
    local_1a0.sz = uVar13;
    local_1a0.cap = uVar13;
    local_1a0.data = (int *)malloc((ulong)uVar13 * 4);
    if (uVar13 != 0) {
      uVar22 = 0;
      do {
        local_1a0.data[uVar22] = uStack_290[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar13 != uVar22);
    }
    LVar8 = getEvidenceLit(this,&local_1a0);
    if (local_1a0.data != (int *)0x0) {
      free(local_1a0.data);
    }
    local_1a0.data = (int *)0x0;
    bVar5 = true;
    if (LVar8.x != 1) {
      if (so.lazy == true) {
        lVar12 = (long)(iVar7 - iVar10) * (long)this->nodesSeen;
        local_268._0_8_ = malloc(lVar12 * 4 + 0x10);
        *(uint *)local_268._0_8_ = ((int)lVar12 + 2) * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_268);
        pCVar24 = (Clause *)local_268._0_8_;
        if (*(uint *)local_268._0_8_ < 0x200) goto LAB_001461cd;
        *(int *)(local_268._0_8_ + 8) = LVar8.x;
        uVar22 = (ulong)local_298 & 0xffffffff;
        local_1b0.sz = local_298._0_4_;
        local_1b0.cap = local_298._0_4_;
        local_1b0.data = (int *)malloc(uVar22 * 4);
        if (uVar22 != 0) {
          uVar14 = 0;
          do {
            local_1b0.data[uVar14] = uStack_290[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar22 != uVar14);
        }
        uVar22 = local_278._0_8_ & 0xffffffff;
        local_1c0.sz = local_278.sz;
        local_1c0.cap = local_278.sz;
        local_1c0.data = (int *)malloc(uVar22 * 4);
        if (uVar22 != 0) {
          uVar14 = 0;
          do {
            local_1c0.data[uVar14] = local_278.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar22 != uVar14);
        }
        explainAcantreachB(this,pCVar24,2,&local_1b0,&local_1c0,-1,-1);
        if (local_1c0.data != (int *)0x0) {
          free(local_1c0.data);
        }
        local_1c0.data = (int *)0x0;
        if (local_1b0.data != (int *)0x0) {
          free(local_1b0.data);
        }
        local_1b0.data = (int *)0x0;
      }
      else {
        pCVar24 = (Clause *)0x0;
      }
      uVar22 = local_278._0_8_ & 0xffffffff;
      if (local_278.sz != 0) {
        uVar14 = 0;
        do {
          lVar15 = (long)local_278.data[uVar14];
          pIVar21 = this->x[lVar15].var;
          iVar7 = (pIVar21->min).v;
          lVar12 = (long)this->x[lVar15].b;
          if ((iVar7 != (pIVar21->max).v) || (iVar7 + lVar12 != lVar15)) {
            iVar7 = (*(pIVar21->super_Var).super_Branching._vptr_Branching[0x10])
                              (pIVar21,lVar15 - lVar12,pCVar24,1);
            if ((char)iVar7 == '\0') {
              bVar5 = false;
              break;
            }
            uVar22 = local_278._0_8_ & 0xffffffff;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar22);
      }
    }
    if (local_278.data != (int *)0x0) {
      free(local_278.data);
    }
    if (uStack_290 != (int *)0x0) {
      free(uStack_290);
    }
    if (!bVar5) {
LAB_001461a8:
      bVar5 = false;
      goto LAB_001461aa;
    }
  }
  pvVar18 = local_200;
  if ((this->pruneRoot == true) && (1 < (int)uVar20)) {
    local_278.sz = 0;
    local_278.cap = 0;
    local_278.data = (int *)0x0;
    local_268._0_8_ = (Clause *)0x0;
    local_268.data = (int *)0x0;
    local_298 = (undefined1  [8])((ulong)local_298 & 0xffffffff00000000);
    if (*(int *)&(this->super_Propagator).field_0x14 < 1) {
      uVar13 = 0;
    }
    else {
      iVar7 = 0;
      do {
        pvVar17 = &local_278;
        if ((uVar20 <= (uint)this->index[iVar7]) || (pvVar17 = &local_268, this->index[iVar7] != 0))
        {
          vec<int>::push(pvVar17,(int *)local_298);
        }
        iVar7 = local_298._0_4_ + 1;
        local_298._0_4_ = iVar7;
      } while (iVar7 < *(int *)&(this->super_Propagator).field_0x14);
      uVar13 = local_278.sz;
    }
    local_1d0.sz = uVar13;
    local_1d0.cap = uVar13;
    local_1d0.data = (int *)malloc((ulong)uVar13 * 4);
    if (uVar13 != 0) {
      uVar22 = 0;
      do {
        local_1d0.data[uVar22] = local_278.data[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar13 != uVar22);
    }
    LVar8 = getEvidenceLit(this,&local_1d0);
    if (local_1d0.data != (int *)0x0) {
      free(local_1d0.data);
    }
    local_1d0.data = (int *)0x0;
    if (LVar8.x != 1) {
      if (so.lazy == true) {
        iVar7 = local_278.sz * local_268.sz + 2;
        local_298 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
        *(uint *)local_298 = iVar7 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
        auVar23 = local_298;
        if (*(uint *)local_298 < 0x200) {
LAB_001461cd:
          abort();
        }
        *(int *)((long)local_298 + 8) = LVar8.x;
        uVar22 = local_268._0_8_ & 0xffffffff;
        local_1e0.sz = local_268.sz;
        local_1e0.cap = local_268.sz;
        local_1e0.data = (int *)malloc(uVar22 * 4);
        if (uVar22 != 0) {
          uVar14 = 0;
          do {
            local_1e0.data[uVar14] = local_268.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar22 != uVar14);
        }
        uVar22 = local_278._0_8_ & 0xffffffff;
        local_1f0.sz = local_278.sz;
        local_1f0.cap = local_278.sz;
        local_1f0.data = (int *)malloc(uVar22 * 4);
        if (uVar22 != 0) {
          uVar14 = 0;
          do {
            local_1f0.data[uVar14] = local_278.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar22 != uVar14);
        }
        explainAcantreachB(this,(Clause *)auVar23,2,&local_1e0,&local_1f0,-1,-1);
        if (local_1f0.data != (int *)0x0) {
          free(local_1f0.data);
        }
        local_1f0.data = (int *)0x0;
        if (local_1e0.data != (int *)0x0) {
          free(local_1e0.data);
        }
        local_1e0.data = (int *)0x0;
      }
      else {
        auVar23 = (undefined1  [8])0x0;
      }
      iVar7 = *(int *)&(this->super_Propagator).field_0x14;
      if (0 < iVar7) {
        uVar22 = 0;
        do {
          if ((uVar22 != local_24c) && (this->index[uVar22] < (int)uVar20)) {
            uStack_290 = (int *)CONCAT44((int)uVar22,local_24c);
            local_288 = false;
            local_298 = auVar23;
            vec<SubCircuit<4>::PROP>::push(local_200,(PROP *)local_298);
            iVar7 = *(int *)&(this->super_Propagator).field_0x14;
          }
          uVar22 = uVar22 + 1;
        } while ((long)uVar22 < (long)iVar7);
      }
    }
    if (local_268.data != (int *)0x0) {
      free(local_268.data);
    }
    pvVar18 = local_200;
    if (local_278.data != (int *)0x0) {
      free(local_278.data);
    }
  }
  bVar5 = true;
  if (pvVar18->sz != 0) {
    lVar12 = 0x10;
    uVar22 = 0;
    do {
      pPVar2 = (this->propQueue).data;
      uVar3 = *(undefined8 *)((long)pPVar2 + lVar12 + -0x10);
      lVar15 = (long)*(int *)((long)pPVar2 + lVar12 + -4);
      pIVar11 = this->x + *(int *)((long)pPVar2 + lVar12 + -8);
      if ((*(byte *)((long)&pPVar2->reason + lVar12) & 1) == 0) {
        lVar15 = lVar15 - pIVar11->b;
        pIVar21 = pIVar11->var;
        if ((((pIVar21->min).v <= lVar15) && (lVar15 <= (pIVar21->max).v)) &&
           ((pIVar21->vals == (Tchar *)0x0 || (pIVar21->vals[lVar15].v != '\0')))) {
          iVar7 = (*(pIVar21->super_Var).super_Branching._vptr_Branching[0x11])
                            (pIVar21,lVar15,uVar3,1);
          cVar6 = (char)iVar7;
          goto LAB_0014618e;
        }
      }
      else {
        pIVar21 = pIVar11->var;
        iVar7 = (pIVar21->min).v;
        if ((iVar7 != (pIVar21->max).v) || ((long)iVar7 + (long)pIVar11->b != lVar15)) {
          iVar7 = (*(pIVar21->super_Var).super_Branching._vptr_Branching[0x10])
                            (pIVar21,lVar15 - pIVar11->b,uVar3,1);
          cVar6 = (char)iVar7;
LAB_0014618e:
          if (cVar6 == '\0') goto LAB_001461a8;
        }
      }
      uVar22 = uVar22 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar22 < pvVar18->sz);
  }
LAB_001461aa:
  if (local_2a8.data != (int *)0x0) {
    free(local_2a8.data);
  }
  return bVar5;
}

Assistant:

bool propagateSCC(int root) {
		int backfrom = 0;  // the last back edge found
		int backto = 0;
		int numback = 0;  // the number of back edges found

		vec<int> thisSubtree;

		thisSubtree.reserve(size);
		prev.clear();
		earlier.clear();
		later.clear();

		assert(!x[root].isFixed() || x[root].getVal() != root);
		for (int i = 0; i < size; i++) {
			index[i] = -1;  // unvisited
		}

		index[root] = 0;  // first node visited
		lowlink[root] = 0;

		nodesSeen = 1;  // only seen root node
		propQueue.clear();

		// original subtree is just the root node
		int startSubtree = 0;
		int endSubtree = 0;

		// explore children of the root node
		for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i) {
			const int child = *i;

			if (index[child] == -1)  // if haven't explored this yet
			{
				numback = 0;
				if (!exploreSubtree(child, startSubtree, endSubtree, &backfrom, &backto, &numback)) {
					// fprintf(stderr, "failed in subtree\n");
					return false;  // fail if we found a scc within the child
				}

				// Find the nodes in the subtree we just explored and the ones still to be explored
				thisSubtree.clear();
				later.clear();
				for (int i = 0; i < size; i++) {
					if (index[i] < 0) {
						later.push(i);
					} else if (index[i] > endSubtree) {
						thisSubtree.push(i);
					}
				}

				const Lit evidenceThis = getEvidenceLit(thisSubtree);
				Lit evidenceOther = getEvidenceLit(prev);
				vec<int> alloutside;
				if (prev.size() == 0) {
					for (unsigned int i = 0; i < later.size(); i++) {
						alloutside.push(later[i]);
					}
					alloutside.push(root);
					evidenceOther = getEvidenceLit(alloutside);
				}

				if (evidenceThis != lit_True && evidenceOther != lit_True) {
					// If there's no edge from the new subtree back to the
					// previous one and both of these groups has
					// a variable definitely in, fail
					if (numback == 0) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.nobackedge++;
						if (so.lazy) {
							// If prev is empty then this is the first subtree,
							// and we just need to say that
							// the nodes in this subtree can't reach the
							// unexplored nodes or the root.
							// This is only a problem if something outside this subtree has to be in.
							if (prev.size() == 0) {
								Clause* r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside
								explainAcantreachB(r, 3, thisSubtree, alloutside, thisSubtree[0], alloutside[0]);
								x[thisSubtree[0]].setVal(alloutside[0], r);

								return false;
							}

							// Assuming we have at least one previous subtree,
							// the reason we're failing is that
							// 1. nodes in earlier subtrees can't reach the
							// previous one this one or unexplored ones,
							// 2. nodes in the previous subtree can't reach
							// this one or unexplored ones,
							// 3. and nodes in this subtree can't reach the
							// previous one or unexplored ones.
							vec<int> prev_later;
							for (unsigned int i = 0; i < prev.size(); i++) {
								prev_later.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prev_later.push(later[i]);
							}
							vec<int> prev_this_later;
							for (unsigned int i = 0; i < prev_later.size(); i++) {
								prev_this_later.push(prev_later[i]);
							}
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								prev_this_later.push(thisSubtree[i]);
							}
							vec<int> this_later;
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								this_later.push(thisSubtree[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								this_later.push(later[i]);
							}

							const int size1 = earlier.size() * prev_this_later.size();
							const int size2 = prev.size() * this_later.size();
							const int size3 = thisSubtree.size() * prev_later.size();
							assert(prev_later.size() > 0);
							Clause* r = Reason_new(size1 + size2 + size3 + 2);
							(*r)[1] = evidenceThis;
							(*r)[2] = evidenceOther;
							// 1. Earlier can't reach prev, this or later
							explainAcantreachB(r, 3, earlier, prev_this_later);

							// 2. Prev can't reach this or later
							explainAcantreachB(r, 3 + size1, prev, this_later);

							// 3. this can't reach prev or later
							explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, thisSubtree[0],
																 prev_later[0]);
							x[thisSubtree[0]].setVal(prev_later[0], r);
						}
						return false;
					}

					// If there's only one, the back edge is required (only propagate if the option is set)
					if (fixReq && numback == 1) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.fixedBackedge++;
						Clause* r = nullptr;
						if (so.lazy) {
							// If this is the first subtree, the reason we're setting this link is that
							// there is no other link between nodes of this subtree to nodes outside the subtree
							// including the root
							if (prev.size() == 0) {
								r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside (except backfrom to backto)
								explainAcantreachB(r, 3, thisSubtree, alloutside, backfrom, backto);
							} else {
								// Otherwise we have at least one previous subtree.
								// The reason is the same as when failing above,
								// but we leave out the one we're setting
								vec<int> prev_later;
								for (unsigned int i = 0; i < prev.size(); i++) {
									prev_later.push(prev[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									prev_later.push(later[i]);
								}
								vec<int> prev_this_later;
								for (unsigned int i = 0; i < prev_later.size(); i++) {
									prev_this_later.push(prev_later[i]);
								}
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									prev_this_later.push(thisSubtree[i]);
								}
								vec<int> this_later;
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									this_later.push(thisSubtree[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									this_later.push(later[i]);
								}

								const int size1 = earlier.size() * prev_this_later.size();
								const int size2 = prev.size() * this_later.size();
								const int size3 = thisSubtree.size() * prev_later.size();
								r = Reason_new(size1 + size2 + size3 + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;

								// 1. Earlier can't reach prev, this or later
								explainAcantreachB(r, 3, earlier, prev_this_later);

								// 2. Prev can't reach this or later
								explainAcantreachB(r, 3 + size1, prev, this_later);

								// 3. this can't reach prev or unexplored (except for the one we're setting)
								explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, backfrom, backto);
							}
						}

						addPropagation(true, backfrom, backto, r);
					}
				}

				// When a new subtree has been explored, update the prev and earlier vectors (only necessary
				// if explaining)
				for (unsigned int i = 0; i < prev.size(); i++) {
					earlier.push(prev[i]);
				}
				prev.clear();
				for (unsigned int i = 0; i < thisSubtree.size(); i++) {
					prev.push(thisSubtree[i]);
				}

				// Set the new subtree boundaries
				startSubtree = endSubtree + 1;
				endSubtree = nodesSeen - 1;
			}
		}

		// If we haven't reached all of the nodes and something we have reached has to
		// be included, then set everything outside to take its own index
		if (nodesSeen != size) {
			vec<int> seen;
			vec<int> notseen;

			for (int var = 0; var < size; var++) {
				if (index[var] >= 0) {
					seen.push(var);
				} else {
					notseen.push(var);
				}
			}
			const int numNotSeen = size - nodesSeen;
			assert(static_cast<int>(seen.size()) == nodesSeen);
			assert(static_cast<int>(notseen.size()) == numNotSeen);

			const Lit evidenceSeen = getEvidenceLit(seen);
			if (evidenceSeen != lit_True) {
				// XXX [AS] Commented following line, because propagator related statistics
				// should be collected within the propagator class.
				// engine.disconnected++;
				Clause* r = nullptr;

				if (so.lazy) {
					// need to say that each seen node doesn't reach any non-seen node
					r = Reason_new(nodesSeen * numNotSeen + 2);
					(*r)[1] = evidenceSeen;
					explainAcantreachB(r, 2, seen, notseen);
				}
				for (unsigned int i = 0; i < notseen.size(); i++) {
					const int outsideVar = notseen[i];
					if (x[outsideVar].setValNotR(outsideVar)) {
						if (!x[outsideVar].setVal(outsideVar, r)) {
							return false;
						}
					}
				}
			}
		}

		// If we're pruning root edges and there was more than one subtree, prune edges from the root to
		// earlier subtrees
		if (pruneRoot && startSubtree > 1) {
			// Check there's evidence
			// First find the nodes in the last subtree (and disconnected nodes) and those in the earlier
			// ones

			vec<int> lastSubtreeAndOutside;
			vec<int> earlierSubtree;
			for (int i = 0; i < size; i++) {
				if (index[i] >= startSubtree || index[i] < 0) {
					lastSubtreeAndOutside.push(i);
				} else if (index[i] > 0) {  // The root is considered in no subtree
					earlierSubtree.push(i);
				} else {
					assert(i == root);
				}
			}
			assert(earlierSubtree.size() > 0);
			assert(earlierSubtree.size() + lastSubtreeAndOutside.size() + 1 ==
						 static_cast<unsigned int>(size));
			const Lit evidenceLast = getEvidenceLit(lastSubtreeAndOutside);
			if (evidenceLast != lit_True) {
				// Build the reason if necessary (it will be the same for all of the pruned edges)
				Clause* r = nullptr;
				if (so.lazy) {
					// Reason should state that no var in an earlier sub tree reaches a var
					// in the last subtree or outside
					r = Reason_new(earlierSubtree.size() * lastSubtreeAndOutside.size() + 2);
					(*r)[1] = evidenceLast;
					explainAcantreachB(r, 2, earlierSubtree, lastSubtreeAndOutside);
				}

				// Prune all edges from the root to nodes in earlier subtrees
				for (int i = 0; i < size; i++) {
					if (i != root && index[i] < startSubtree) {
						addPropagation(false, root, i, r);
					}
				}

				/* for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i)
				 {
						 if(*i != root && index[*i] < startSubtree)
						 {
								 // XXX [AS] Commented following line, because propagator related statistics
								 // should be collected within the propagator class.
								 //engine.prunedRoot++;
								 addPropagation(false, root, *i, r);
						 }
				 }*/
			}
		}

		// Perform the propagations
		for (unsigned int i = 0; i < propQueue.size(); i++) {
			PROP const p = propQueue[i];
			// fprintf(stderr, "propagating\n");
			if (p.fix) {
				if (x[p.var].setValNotR(p.val)) {
					if (!x[p.var].setVal(p.val, p.reason)) {
						return false;
					}
				}
			} else {
				if (x[p.var].remValNotR(p.val)) {
					if (!x[p.var].remVal(p.val, p.reason)) {
						return false;
					}
				}
			}
		}
		return true;
	}